

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_fchang_2003.h
# Opt level: O1

Point2i __thiscall
CT::MemTracer(CT *this,MemMat<unsigned_char> *img,MemMat<int> *img_labels,Point2i *p,int *i_prev,
             bool *b_isolated)

{
  int *piVar1;
  char cVar2;
  long lVar3;
  long *plVar4;
  long lVar5;
  long *plVar6;
  Point2i PVar7;
  Point2i PVar8;
  Point2i PVar9;
  Point2i PVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  undefined1 *in_stack_00000008;
  
  iVar11 = *(int *)b_isolated;
  uVar14 = iVar11 + 9;
  if (-1 < (int)(iVar11 + 2U)) {
    uVar14 = iVar11 + 2U;
  }
  iVar15 = (iVar11 - (uVar14 & 0xfffffff8)) + 2;
  lVar3 = *(long *)&(img_labels->accesses_).field_0x10;
  plVar4 = *(long **)&(img_labels->accesses_).field_0x48;
  lVar5 = *(long *)&(img_labels->img_).field_0x10;
  plVar6 = *(long **)&(img_labels->img_).field_0x48;
  cVar2 = (img->accesses_).field_0xc;
  PVar7 = p[0xf];
  PVar8 = p[0x16];
  PVar9 = p[3];
  PVar10 = p[10];
  uVar17 = 0;
  uVar14 = 0;
  iVar11 = iVar15;
  do {
    switch(iVar11) {
    case 0:
      uVar14 = i_prev[1];
      uVar17 = *i_prev + 1;
      break;
    case 1:
      iVar13 = i_prev[1];
      uVar17 = *i_prev + 1;
      goto LAB_00182744;
    case 2:
      uVar17 = *i_prev;
      iVar13 = i_prev[1];
      goto LAB_00182744;
    case 3:
      iVar13 = i_prev[1];
      uVar17 = *i_prev - 1;
LAB_00182744:
      uVar14 = iVar13 + 1;
      break;
    case 4:
      uVar14 = i_prev[1];
      uVar17 = *i_prev - 1;
      break;
    case 5:
      iVar13 = i_prev[1];
      uVar17 = *i_prev - 1;
      goto LAB_0018275b;
    case 6:
      uVar17 = *i_prev;
      iVar13 = i_prev[1];
      goto LAB_0018275b;
    case 7:
      iVar13 = i_prev[1];
      uVar17 = *i_prev + 1;
LAB_0018275b:
      uVar14 = iVar13 - 1;
    }
    if ((((-1 < (int)uVar14) && (-1 < (int)uVar17)) && ((int)uVar14 < img_labels->rows)) &&
       ((int)uVar17 < img_labels->cols)) {
      uVar16 = (ulong)uVar14;
      uVar18 = (ulong)uVar17;
      piVar1 = (int *)(*plVar4 * uVar16 + lVar3 + uVar18 * 4);
      *piVar1 = *piVar1 + 1;
      if (*(char *)(uVar18 + *plVar6 * uVar16 + lVar5) == cVar2) {
        uVar12 = iVar11 + 0xb;
        if (-1 < (int)(iVar11 + 4U)) {
          uVar12 = iVar11 + 4U;
        }
        *(uint *)b_isolated = (iVar11 - (uVar12 & 0xfffffff8)) + 4;
        *(uint *)&(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling._vptr_Labeling =
             uVar17;
        *(uint *)((long)&(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.
                         _vptr_Labeling + 4) = uVar14;
        return (Point2i)this;
      }
      piVar1 = (int *)(*(long *)PVar8 * uVar16 + (long)PVar7 + uVar18 * 4);
      *piVar1 = *piVar1 + 1;
      *(undefined4 *)(uVar16 * *(long *)PVar10 + (long)PVar9 + uVar18 * 4) = 0xffffffff;
    }
    uVar12 = iVar11 + 8;
    if (-1 < (int)(iVar11 + 1U)) {
      uVar12 = iVar11 + 1U;
    }
    iVar11 = (iVar11 - (uVar12 & 0xfffffff8)) + 1;
    if (iVar11 == iVar15) {
      *in_stack_00000008 = 1;
      *(int *)&(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling._vptr_Labeling =
           *i_prev;
      *(int *)((long)&(this->super_Labeling2D<(Connectivity2D)8,_false>).super_Labeling.
                      _vptr_Labeling + 4) = i_prev[1];
      return (Point2i)this;
    }
  } while( true );
}

Assistant:

cv::Point2i MemTracer(MemMat<unsigned char> &img, MemMat<int> &img_labels, const cv::Point2i &p, int &i_prev, bool &b_isolated) {
        int i_first, i_next;

        // Find the direction to be analyzed
        i_first = i_next = (i_prev + 2) % 8;

        cv::Point2i crd_next;
        do {
            switch (i_next) {
            case 0: crd_next = p + cv::Point2i(1, 0); break;
            case 1: crd_next = p + cv::Point2i(1, 1); break;
            case 2: crd_next = p + cv::Point2i(0, 1); break;
            case 3: crd_next = p + cv::Point2i(-1, 1); break;
            case 4: crd_next = p + cv::Point2i(-1, 0); break;
            case 5: crd_next = p + cv::Point2i(-1, -1); break;
            case 6: crd_next = p + cv::Point2i(0, -1); break;
            case 7: crd_next = p + cv::Point2i(1, -1); break;
            }

            if (crd_next.y >= 0 && crd_next.x >= 0 && crd_next.y < img.rows && crd_next.x < img.cols) {
                if (img(crd_next.y, crd_next.x) == byF) {
                    i_prev = (i_next + 4) % 8;
                    return crd_next;
                }
                else
                    img_labels(crd_next.y, crd_next.x) = -1;
            }

            i_next = (i_next + 1) % 8;
        } while (i_next != i_first);

        b_isolated = true;
        return p;
    }